

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateImageUses
          (ConvertToSampledImagePass *this,Instruction *sampled_image_load)

{
  Instruction *this_00;
  pointer ppIVar1;
  Instruction *this_01;
  DefUseManager *this_02;
  pointer ppIVar2;
  initializer_list<unsigned_int> init_list;
  uint32_t local_7c;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses_of_load;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uses_of_load.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uses_of_load.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uses_of_load.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindUsesOfImage(this,sampled_image_load,&uses_of_load);
  if (uses_of_load.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      uses_of_load.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (Instruction *)0x0;
  }
  else {
    this_01 = CreateImageExtraction(this,sampled_image_load);
    ppIVar1 = uses_of_load.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar2 = uses_of_load.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
        ppIVar2 = ppIVar2 + 1) {
      this_00 = *ppIVar2;
      local_7c = Instruction::result_id(this_01);
      init_list._M_len = 1;
      init_list._M_array = &local_7c;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      Instruction::SetInOperand(this_00,0,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      this_02 = IRContext::get_def_use_mgr((this->super_Pass).context_);
      analysis::DefUseManager::AnalyzeInstUse(this_02,this_00);
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&uses_of_load.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return this_01;
}

Assistant:

Instruction* ConvertToSampledImagePass::UpdateImageUses(
    Instruction* sampled_image_load) {
  std::vector<Instruction*> uses_of_load;
  FindUsesOfImage(sampled_image_load, &uses_of_load);
  if (uses_of_load.empty()) return nullptr;

  auto* extracted_image = CreateImageExtraction(sampled_image_load);
  for (auto* user : uses_of_load) {
    user->SetInOperand(0, {extracted_image->result_id()});
    context()->get_def_use_mgr()->AnalyzeInstUse(user);
  }
  return extracted_image;
}